

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O0

char * dmrC_show_pseudo(dmr_C *C,pseudo_t pseudo)

{
  linearizer_state_t *plVar1;
  symbol *psVar2;
  expression *peVar3;
  long lVar4;
  int iVar5;
  char *pcVar6;
  uint uVar7;
  longlong value;
  expression *expr;
  symbol *sym;
  int i;
  char *buf;
  pseudo_t pseudo_local;
  dmr_C *C_local;
  
  if (pseudo == (pseudo_t)0x0) {
    C_local = (dmr_C *)anon_var_dwarf_3b8f0;
  }
  else if (pseudo == &C->L->void_pseudo) {
    C_local = (dmr_C *)anon_var_dwarf_3b90e;
  }
  else {
    plVar1 = C->L;
    uVar7 = plVar1->n + 1;
    plVar1->n = uVar7;
    C_local = (dmr_C *)(plVar1->pseudo_buffer[0] + ((uVar7 & 3) << 6));
    switch(pseudo->type) {
    case PSEUDO_REG:
      iVar5 = snprintf((char *)C_local,0x40,"%%r%d",(ulong)(uint)pseudo->nr);
      if (pseudo->ident != (ident *)0x0) {
        pcVar6 = dmrC_show_ident(C,pseudo->ident);
        sprintf((char *)((long)&C_local->target + (long)iVar5),"(%s)",pcVar6);
      }
      break;
    case PSEUDO_SYM:
      psVar2 = (pseudo->field_5).sym;
      if ((psVar2->field_15).bb_target == (basic_block *)0x0) {
        if (psVar2->ident == (ident *)0x0) {
          peVar3 = (psVar2->field_14).field_2.initializer;
          snprintf((char *)C_local,0x40,"<anon symbol:%p>",psVar2);
          if (peVar3 != (expression *)0x0) {
            if (*(char *)peVar3 == '\x01') {
              snprintf((char *)C_local,0x40,"<symbol value: %lld>",(peVar3->field_5).field_0.value);
            }
            else if (*(char *)peVar3 == '\x02') {
              C_local = (dmr_C *)dmrC_show_string(C,(peVar3->field_5).field_2.string);
            }
          }
        }
        else {
          pcVar6 = dmrC_show_ident(C,psVar2->ident);
          snprintf((char *)C_local,0x40,"%s",pcVar6);
        }
      }
      else {
        snprintf((char *)C_local,0x40,".L%u",(ulong)((psVar2->field_15).bb_target)->nr);
      }
      break;
    case PSEUDO_VAL:
      lVar4 = (pseudo->field_5).value;
      if ((lVar4 < 0x3e9) && (-0x3e9 < lVar4)) {
        snprintf((char *)C_local,0x40,"$%lld",lVar4);
      }
      else {
        snprintf((char *)C_local,0x40,"$%#llx",lVar4);
      }
      break;
    case PSEUDO_ARG:
      snprintf((char *)C_local,0x40,"%%arg%d",(ulong)(uint)pseudo->nr);
      break;
    case PSEUDO_PHI:
      iVar5 = snprintf((char *)C_local,0x40,"%%phi%d",(ulong)(uint)pseudo->nr);
      if (pseudo->ident != (ident *)0x0) {
        pcVar6 = dmrC_show_ident(C,pseudo->ident);
        sprintf((char *)((long)&C_local->target + (long)iVar5),"(%s)",pcVar6);
      }
      break;
    default:
      snprintf((char *)C_local,0x40,"<bad pseudo type %d>",(ulong)pseudo->type);
    }
  }
  return (char *)C_local;
}

Assistant:

const char *dmrC_show_pseudo(struct dmr_C *C, pseudo_t pseudo)
{
	char *buf;
	int i;

	if (!pseudo)
		return "no pseudo";
	if (pseudo == VOID_PSEUDO(C))
		return "VOID";
	buf = C->L->pseudo_buffer[3 & ++C->L->n];
	switch(pseudo->type) {
	case PSEUDO_SYM: {
		struct symbol *sym = pseudo->sym;
		struct expression *expr;

		if (sym->bb_target) {
			snprintf(buf, 64, ".L%u", sym->bb_target->nr);
			break;
		}
		if (sym->ident) {
			snprintf(buf, 64, "%s", dmrC_show_ident(C, sym->ident));
			break;
		}
		expr = sym->initializer;
		snprintf(buf, 64, "<anon symbol:%p>", sym);
		if (expr) {
			switch (expr->type) {
			case EXPR_VALUE:
				snprintf(buf, 64, "<symbol value: %lld>", expr->value);
				break;
			case EXPR_STRING:
				return dmrC_show_string(C, expr->string);
			default:
				break;
			}
		}
		break;
	}
	case PSEUDO_REG:
		i = snprintf(buf, 64, "%%r%d", pseudo->nr);
		if (pseudo->ident)
			sprintf(buf+i, "(%s)", dmrC_show_ident(C, pseudo->ident));
		break;
	case PSEUDO_VAL: {
		long long value = pseudo->value;
		if (value > 1000 || value < -1000)
			snprintf(buf, 64, "$%#llx", value);
		else
			snprintf(buf, 64, "$%lld", value);
		break;
	}
	case PSEUDO_ARG:
		snprintf(buf, 64, "%%arg%d", pseudo->nr);
		break;
	case PSEUDO_PHI:
		i = snprintf(buf, 64, "%%phi%d", pseudo->nr);
		if (pseudo->ident)
			sprintf(buf+i, "(%s)", dmrC_show_ident(C, pseudo->ident));
		break;
	default:
		snprintf(buf, 64, "<bad pseudo type %d>", pseudo->type);
	}
	return buf;
}